

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractsocket.cpp
# Opt level: O3

QDebug operator<<(QDebug debug,SocketState state)

{
  long *plVar1;
  int in_EDX;
  undefined4 in_register_00000034;
  QDebug *pQVar2;
  storage_type *psVar3;
  QTextStream *pQVar4;
  Stream *pSVar5;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QDebugStateSaver saver;
  undefined1 *local_50;
  QArrayData *local_48 [3];
  long local_30;
  
  pQVar2 = (QDebug *)CONCAT44(in_register_00000034,state);
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_50,pQVar2);
  plVar1 = (long *)QDebug::resetFormat();
  *(undefined1 *)(*plVar1 + 0x30) = 0;
  pQVar4 = (QTextStream *)pQVar2->stream;
  switch(in_EDX) {
  case 0:
    psVar3 = (storage_type *)0x21;
    break;
  case 1:
    goto LAB_001c2489;
  case 2:
LAB_001c2489:
    psVar3 = (storage_type *)0x20;
    break;
  case 3:
    goto LAB_001c249c;
  case 4:
    psVar3 = (storage_type *)0x1b;
    break;
  case 5:
LAB_001c249c:
    psVar3 = (storage_type *)0x1f;
    break;
  case 6:
    psVar3 = (storage_type *)0x1d;
    break;
  default:
    QVar6.m_data = (storage_type *)0x1d;
    QVar6.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar6);
    QTextStream::operator<<(pQVar4,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    pQVar4 = (QTextStream *)pQVar2->stream;
    if (pQVar4[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar4,' ');
      pQVar4 = (QTextStream *)pQVar2->stream;
    }
    QTextStream::operator<<(pQVar4,in_EDX);
    pQVar4 = (QTextStream *)pQVar2->stream;
    if (pQVar4[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar4,' ');
      pQVar4 = (QTextStream *)pQVar2->stream;
    }
    QTextStream::operator<<(pQVar4,')');
    pSVar5 = pQVar2->stream;
    if (pSVar5[0x30] != (Stream)0x1) goto LAB_001c2501;
    goto LAB_001c24f7;
  }
  QVar7.m_data = psVar3;
  QVar7.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar7);
  QTextStream::operator<<(pQVar4,(QString *)local_48);
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  pSVar5 = pQVar2->stream;
  if (pSVar5[0x30] != (Stream)0x0) {
LAB_001c24f7:
    QTextStream::operator<<((QTextStream *)pSVar5,' ');
  }
LAB_001c2501:
  pSVar5 = pQVar2->stream;
  pQVar2->stream = (Stream *)0x0;
  *(Stream **)debug.stream = pSVar5;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return (QDebug)debug.stream;
}

Assistant:

Q_NETWORK_EXPORT QDebug operator<<(QDebug debug, QAbstractSocket::SocketState state)
{
    QDebugStateSaver saver(debug);
    debug.resetFormat().nospace();
    switch (state) {
    case QAbstractSocket::UnconnectedState:
        debug << "QAbstractSocket::UnconnectedState";
        break;
    case QAbstractSocket::HostLookupState:
        debug << "QAbstractSocket::HostLookupState";
        break;
    case QAbstractSocket::ConnectingState:
        debug << "QAbstractSocket::ConnectingState";
        break;
    case QAbstractSocket::ConnectedState:
        debug << "QAbstractSocket::ConnectedState";
        break;
    case QAbstractSocket::BoundState:
        debug << "QAbstractSocket::BoundState";
        break;
    case QAbstractSocket::ListeningState:
        debug << "QAbstractSocket::ListeningState";
        break;
    case QAbstractSocket::ClosingState:
        debug << "QAbstractSocket::ClosingState";
        break;
    default:
        debug << "QAbstractSocket::SocketState(" << int(state) << ')';
        break;
    }
    return debug;
}